

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysp_type_enum_free(lysf_ctx *ctx,lysp_type_enum *item)

{
  undefined8 *puVar1;
  lysp_ext_instance *plVar2;
  lysp_qname *plVar3;
  long lVar4;
  ulong uVar5;
  lysp_ext_instance *plVar6;
  
  lydict_remove(ctx->ctx,item->name);
  lydict_remove(ctx->ctx,item->dsc);
  lydict_remove(ctx->ctx,item->ref);
  plVar3 = item->iffeatures;
  if (plVar3 != (lysp_qname *)0x0) {
    uVar5 = 0xffffffffffffffff;
    lVar4 = 0;
    do {
      uVar5 = uVar5 + 1;
      if (*(ulong *)&plVar3[-1].flags <= uVar5) {
        free(&plVar3[-1].flags);
        break;
      }
      puVar1 = (undefined8 *)((long)&plVar3->str + lVar4);
      lVar4 = lVar4 + 0x18;
      lydict_remove(ctx->ctx,(char *)*puVar1);
      plVar3 = item->iffeatures;
    } while (plVar3 != (lysp_qname *)0x0);
  }
  plVar2 = item->exts;
  if (plVar2 != (lysp_ext_instance *)0x0) {
    plVar6 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar4 = 0;
    do {
      plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
      if (plVar2[-1].exts <= plVar6) {
        free(&plVar2[-1].exts);
        return;
      }
      plVar2 = (lysp_ext_instance *)((long)&plVar2->name + lVar4);
      lVar4 = lVar4 + 0x70;
      lysp_ext_instance_free(ctx,plVar2);
      plVar2 = item->exts;
    } while (plVar2 != (lysp_ext_instance *)0x0);
  }
  return;
}

Assistant:

static void
lysp_type_enum_free(struct lysf_ctx *ctx, struct lysp_type_enum *item)
{
    lydict_remove(ctx->ctx, item->name);
    lydict_remove(ctx->ctx, item->dsc);
    lydict_remove(ctx->ctx, item->ref);
    FREE_ARRAY(ctx->ctx, item->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, item->exts, lysp_ext_instance_free);
}